

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall args::Command::Validate(Command *this,string *shortprefix,string *longprefix)

{
  pointer ppBVar1;
  Base *pBVar2;
  Subparser *pSVar3;
  Base **ppBVar4;
  int iVar5;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  _Var6;
  runtime_error *this_00;
  pointer ppBVar7;
  anon_class_1_0_00000001 onValidationError;
  ostringstream problem;
  anon_class_1_0_00000001 local_1c9;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  iVar5 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((char)iVar5 != '\0') {
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar7 = (this->super_Group).children.
                   super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar7 != ppBVar1; ppBVar7 = ppBVar7 + 1) {
      pBVar2 = *ppBVar7;
      iVar5 = (*pBVar2->_vptr_Base[6])(pBVar2);
      if ((char)iVar5 != '\0') {
        iVar5 = (*pBVar2->_vptr_Base[2])(pBVar2);
        if ((char)iVar5 == '\0') {
          Validate::anon_class_1_0_00000001::operator()(&local_1c9);
        }
      }
      (*pBVar2->_vptr_Base[3])(pBVar2,shortprefix,longprefix);
    }
    pSVar3 = this->subparser;
    if (pSVar3 != (Subparser *)0x0) {
      (*(pSVar3->super_Group).super_Base._vptr_Base[3])(pSVar3,shortprefix,longprefix);
      iVar5 = (*(this->subparser->super_Group).super_Base._vptr_Base[2])();
      if ((char)iVar5 == '\0') {
        Validate::anon_class_1_0_00000001::operator()(&local_1c9);
      }
    }
    if ((this->selectedCommand == (Command *)0x0) && (this->commandIsRequired == true)) {
      ppBVar4 = (this->super_Group).children.
                super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasCommand()const::_lambda(args::Base*)_1_>>
                        ((this->super_Group).children.
                         super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                         super__Vector_impl_data._M_start,ppBVar4);
      if ((_Var6._M_current != ppBVar4) || (this->subparserHasCommand == true)) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Command is required",0x13);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_1c8);
        *(undefined ***)this_00 = &PTR__runtime_error_004b6e28;
        __cxa_throw(this_00,&ValidationError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortprefix, const std::string &longprefix) const override
            {
                if (!Matched())
                {
                    return;
                }

                auto onValidationError = [&]
                {
                    std::ostringstream problem;
                    problem << "Group validation failed somewhere!";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                };

                for (Base *child: Children())
                {
                    if (child->IsGroup() && !child->Matched())
                    {
                        onValidationError();
                    }

                    child->Validate(shortprefix, longprefix);
                }

                if (subparser != nullptr)
                {
                    subparser->Validate(shortprefix, longprefix);
                    if (!subparser->Matched())
                    {
                        onValidationError();
                    }
                }

                if (selectedCommand == nullptr && commandIsRequired && (Group::HasCommand() || subparserHasCommand))
                {
                    std::ostringstream problem;
                    problem << "Command is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                }
            }